

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::SerialArenaChunk
          (SerialArenaChunk *this,uint32_t capacity,void *me,SerialArena *serial)

{
  char *pcVar1;
  CopyConst<char,_ElementType<0UL>_> *this_00;
  CopyConst<char,_ElementType<1UL>_> *this_01;
  CopyConst<char,_ElementType<2UL>_> *this_02;
  uint local_5c;
  uint32_t i_1;
  atomic<google::protobuf::internal::SerialArena_*> *arenas;
  uint32_t i;
  atomic<void_*> *ids;
  layout_type layout;
  SerialArena *serial_local;
  void *me_local;
  uint32_t capacity_local;
  SerialArenaChunk *this_local;
  
  layout.
  super_LayoutWithStaticSizes<std::integer_sequence<unsigned_long>,_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
  .
  super_LayoutType<std::integer_sequence<unsigned_long>,_sizeof___(Ts)___adl_barrier::Min(sizeof___(Ts),_integer_sequence<unsigned_long>::size()),_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
  .size_[2] = (size_t)serial;
  Layout((layout_type *)&ids,(ulong)capacity);
  pcVar1 = ptr(this);
  this_00 = absl::lts_20240722::container_internal::internal_layout::
            LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
            ::Pointer<0ul,char>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                 *)&ids,pcVar1);
  SerialArenaChunkHeader::SerialArenaChunkHeader(this_00,capacity,1);
  pcVar1 = ptr(this);
  this_01 = absl::lts_20240722::container_internal::internal_layout::
            LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
            ::Pointer<1ul,char>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                 *)&ids,pcVar1);
  std::atomic<void_*>::atomic(this_01,me);
  for (arenas._4_4_ = 1; arenas._4_4_ < capacity; arenas._4_4_ = arenas._4_4_ + 1) {
    std::atomic<void_*>::atomic(this_01 + arenas._4_4_,(__pointer_type)0x0);
  }
  pcVar1 = ptr(this);
  this_02 = absl::lts_20240722::container_internal::internal_layout::
            LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
            ::Pointer<2ul,char>((LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader,std::atomic<void*>,std::atomic<google::protobuf::internal::SerialArena*>>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                                 *)&ids,pcVar1);
  std::atomic<google::protobuf::internal::SerialArena_*>::atomic
            (this_02,(__pointer_type)
                     layout.
                     super_LayoutWithStaticSizes<std::integer_sequence<unsigned_long>,_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
                     .
                     super_LayoutType<std::integer_sequence<unsigned_long>,_sizeof___(Ts)___adl_barrier::Min(sizeof___(Ts),_integer_sequence<unsigned_long>::size()),_google::protobuf::internal::SerialArenaChunkHeader,_std::atomic<void_*>,_std::atomic<google::protobuf::internal::SerialArena_*>_>
                     .size_[2]);
  for (local_5c = 1; local_5c < capacity; local_5c = local_5c + 1) {
    std::atomic<google::protobuf::internal::SerialArena_*>::atomic
              (this_02 + local_5c,(__pointer_type)0x0);
  }
  return;
}

Assistant:

SerialArenaChunk(uint32_t capacity, void* me, SerialArena* serial) {
    // We use `layout`/`ids`/`arenas` local variables to avoid recomputing
    // offsets if we were to call id(i)/arena(i) repeatedly.
    const layout_type layout = Layout(capacity);
    new (layout.Pointer<kHeader>(ptr())) SerialArenaChunkHeader{capacity, 1};

    std::atomic<void*>* ids = layout.Pointer<kIds>(ptr());
    new (&ids[0]) std::atomic<void*>{me};
    for (uint32_t i = 1; i < capacity; ++i) {
      new (&ids[i]) std::atomic<void*>{nullptr};
    }

    std::atomic<SerialArena*>* arenas = layout.Pointer<kArenas>(ptr());
    new (&arenas[0]) std::atomic<SerialArena*>{serial};
    for (uint32_t i = 1; i < capacity; ++i) {
      new (&arenas[i]) std::atomic<SerialArena*>{nullptr};
    }
  }